

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateUtils.cpp
# Opt level: O0

tm * ApprovalTests::DateUtils::createTm(int year,int month,int day,int hour,int minute,int second)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  tm *in_RDI;
  int in_R8D;
  int in_R9D;
  tm *timeinfo;
  int in_stack_00000008;
  
  memset(in_RDI,0,0x38);
  in_RDI->tm_year = in_ESI + -0x76c;
  in_RDI->tm_mon = in_EDX + -1;
  in_RDI->tm_mday = in_ECX;
  in_RDI->tm_hour = in_R8D;
  in_RDI->tm_min = in_R9D;
  in_RDI->tm_sec = in_stack_00000008;
  return in_RDI;
}

Assistant:

std::tm
    DateUtils::createTm(int year, int month, int day, int hour, int minute, int second)
    {
        std::tm timeinfo = tm();
        timeinfo.tm_year = year - 1900;
        timeinfo.tm_mon = month - 1;
        timeinfo.tm_mday = day;
        timeinfo.tm_hour = hour;
        timeinfo.tm_min = minute;
        timeinfo.tm_sec = second;
        return timeinfo;
    }